

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

string * vk::BinaryRegistryDetail::anon_unknown_8::getIndexPath
                   (string *__return_storage_ptr__,string *dirName)

{
  char *__s;
  allocator<char> local_85 [13];
  FilePath local_78;
  FilePath local_58;
  FilePath local_38;
  string *local_18;
  string *dirName_local;
  
  local_18 = dirName;
  dirName_local = __return_storage_ptr__;
  de::FilePath::FilePath(&local_58,dirName);
  de::FilePath::FilePath(&local_78,"index.bin");
  de::FilePath::join(&local_38,&local_58,&local_78);
  __s = de::FilePath::getPath(&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_85);
  std::allocator<char>::~allocator(local_85);
  de::FilePath::~FilePath(&local_38);
  de::FilePath::~FilePath(&local_78);
  de::FilePath::~FilePath(&local_58);
  return __return_storage_ptr__;
}

Assistant:

string getIndexPath (const std::string& dirName)
{
	return de::FilePath::join(dirName, "index.bin").getPath();
}